

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O2

bool __thiscall Spi::eraseFlash(Spi *this)

{
  FILE *pFVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  
  fwrite("reset..\n",8,1,_stdout);
  flash_chip_deselect(this);
  local_38.__r = 0xfa;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_38);
  pFVar1 = _stdout;
  iVar2 = get_cdone(this);
  pcVar4 = "high";
  pcVar3 = "high";
  if (iVar2 == 0) {
    pcVar3 = "low";
  }
  fprintf(pFVar1,"cdone: %s\n",pcVar3);
  flash_reset(this);
  flash_power_up(this);
  flash_read_id(this);
  flash_write_enable(this);
  flash_bulk_erase(this);
  flash_wait(this);
  flash_power_down(this);
  set_gpio(this,1,1);
  local_38.__r = 0xfa;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_38);
  pFVar1 = _stdout;
  iVar2 = get_cdone(this);
  if (iVar2 == 0) {
    pcVar4 = "low";
  }
  fprintf(pFVar1,"cdone: %s\n",pcVar4);
  return true;
}

Assistant:

bool Spi::eraseFlash() {
	fprintf(stdout, "reset..\n");

	flash_chip_deselect();
	std::this_thread::sleep_for(std::chrono::milliseconds(250));

	fprintf(stdout, "cdone: %s\n", get_cdone() ? "high" : "low");

	flash_reset();
	flash_power_up();

	flash_read_id();

	flash_write_enable();
	flash_bulk_erase();
	flash_wait();

	// ---------------------------------------------------------
	// Reset
	// ---------------------------------------------------------

	flash_power_down();

	set_gpio(1, 1);
	std::this_thread::sleep_for(std::chrono::milliseconds(250));

	fprintf(stdout, "cdone: %s\n", get_cdone() ? "high" : "low");

	return true;
}